

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeRhs(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int i,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *newRhs,bool scale)

{
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  type_conflict5 tVar3;
  double *pdVar4;
  undefined7 in_register_00000009;
  long lVar5;
  long lVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  uint *puVar9;
  pointer pnVar10;
  byte bVar11;
  cpp_dec_float<200U,_int,_void> local_120;
  uint local_a0 [28];
  int local_30;
  undefined1 local_2c;
  undefined8 local_28;
  
  bVar11 = 0;
  if ((int)CONCAT71(in_register_00000009,scale) != 0) {
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_120,*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator<
                      (newRhs,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_120);
    if (tVar3) {
      pSVar1 = this->lp_scaler;
      lVar6 = 0x1c;
      pnVar7 = newRhs;
      puVar9 = local_a0;
      for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar9 = (pnVar7->m_backend).data._M_elems[0];
        pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar7 + ((ulong)bVar11 * -2 + 1) * 4);
        puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
      }
      local_30 = (newRhs->m_backend).exp;
      local_2c = (newRhs->m_backend).neg;
      local_28._0_4_ = (newRhs->m_backend).fpclass;
      local_28._4_4_ = (newRhs->m_backend).prec_elem;
      (*pSVar1->_vptr_SPxScaler[0x2e])(&local_120,pSVar1,this,i);
      pnVar2 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar8 = &local_120;
      pnVar10 = pnVar2 + i;
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pnVar10->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + ((ulong)bVar11 * -2 + 1) * 4);
        pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar11 * -2 + 1) * 4);
      }
      pnVar2[i].m_backend.exp = local_120.exp;
      pnVar2[i].m_backend.neg = local_120.neg;
      pnVar2[i].m_backend.fpclass = local_120.fpclass;
      pnVar2[i].m_backend.prec_elem = local_120.prec_elem;
      return;
    }
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&(this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&newRhs->m_backend);
  return;
}

Assistant:

virtual void changeRhs(int i, const R& newRhs, bool scale = false)
   {
      if(scale && newRhs < R(infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPRowSetBase<R>::rhs_w(i) = lp_scaler->scaleRhs(*this, i, newRhs);
      }
      else
         LPRowSetBase<R>::rhs_w(i) = newRhs;

      assert(isConsistent());
   }